

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  container_t *pcVar5;
  int iVar6;
  array_container_t *src;
  uint8_t local_39;
  container_t *local_38;
  
  uVar3 = ra_get_index(x1_arr,hb);
  uVar4 = ra_get_index(ans_arr,hb);
  if (-1 < (int)uVar3) {
    uVar2 = x1_arr->typecodes[uVar3 & 0xffff];
    src = (array_container_t *)x1_arr->containers[uVar3 & 0xffff];
    if (uVar2 == '\x04') {
      uVar2 = *(uint8_t *)&src->array;
      src = *(array_container_t **)src;
    }
    iVar6 = lb_end + 1;
    local_38 = (container_t *)0x0;
    if (uVar2 == '\x03') {
      iVar6 = run_container_negation_range((run_container_t *)src,(uint)lb_start,iVar6,&local_38);
      uVar2 = (uint8_t)iVar6;
    }
    else {
      if (uVar2 == '\x02') {
        _Var1 = array_container_negation_range(src,(uint)lb_start,iVar6,&local_38);
      }
      else {
        _Var1 = bitset_container_negation_range
                          ((bitset_container_t *)src,(uint)lb_start,iVar6,&local_38);
      }
      uVar2 = '\x02' - _Var1;
    }
    pcVar5 = local_38;
    iVar6 = container_get_cardinality(local_38,uVar2);
    if (iVar6 == 0) {
      container_free(pcVar5,uVar2);
    }
    else {
      ra_insert_new_key_value_at(ans_arr,~uVar4,hb,pcVar5,uVar2);
    }
    return;
  }
  pcVar5 = container_range_of_ones((uint)lb_start,lb_end + 1,&local_39);
  ra_insert_new_key_value_at(ans_arr,~uVar4,hb,pcVar5,local_39);
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}